

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::btMultiBody
          (btMultiBody *this,int n_links,btScalar mass,btVector3 *inertia,bool fixedBase,
          bool canSleep,bool param_6)

{
  undefined8 uVar1;
  btMultibodyLink local_288;
  
  this->_vptr_btMultiBody = (_func_int **)&PTR__btMultiBody_001f1dd0;
  this->m_baseCollider = (btMultiBodyLinkCollider *)0x0;
  this->m_baseName = (char *)0x0;
  (this->m_basePos).m_floats[0] = 0.0;
  (this->m_basePos).m_floats[1] = 0.0;
  (this->m_basePos).m_floats[2] = 0.0;
  (this->m_basePos).m_floats[3] = 0.0;
  *(undefined8 *)((this->m_basePos).m_floats + 3) = 0;
  (this->m_baseQuat).super_btQuadWord.m_floats[1] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[2] = 0.0;
  (this->m_baseQuat).super_btQuadWord.m_floats[3] = 1.0;
  this->m_baseMass = mass;
  uVar1 = *(undefined8 *)(inertia->m_floats + 2);
  *(undefined8 *)(this->m_baseInertia).m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)((this->m_baseInertia).m_floats + 2) = uVar1;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (btMultibodyLink *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_colliders).m_ownsMemory = true;
  (this->m_colliders).m_data = (btMultiBodyLinkCollider **)0x0;
  (this->m_colliders).m_size = 0;
  (this->m_colliders).m_capacity = 0;
  (this->m_deltaV).m_ownsMemory = true;
  (this->m_deltaV).m_data = (float *)0x0;
  (this->m_deltaV).m_size = 0;
  (this->m_deltaV).m_capacity = 0;
  (this->m_realBuf).m_ownsMemory = true;
  (this->m_realBuf).m_data = (float *)0x0;
  (this->m_realBuf).m_size = 0;
  (this->m_realBuf).m_capacity = 0;
  (this->m_vectorBuf).m_ownsMemory = true;
  (this->m_vectorBuf).m_data = (btVector3 *)0x0;
  (this->m_vectorBuf).m_size = 0;
  (this->m_vectorBuf).m_capacity = 0;
  (this->m_matrixBuf).m_ownsMemory = true;
  (this->m_matrixBuf).m_data = (btMatrix3x3 *)0x0;
  (this->m_matrixBuf).m_size = 0;
  (this->m_matrixBuf).m_capacity = 0;
  this->m_fixedBase = fixedBase;
  this->m_awake = true;
  this->m_canSleep = canSleep;
  this->m_sleepTimer = 0.0;
  this->m_linearDamping = 0.04;
  this->m_angularDamping = 0.04;
  this->m_useGyroTerm = true;
  this->m_maxAppliedImpulse = 1000.0;
  this->m_maxCoordinateVelocity = 100.0;
  this->m_hasSelfCollision = true;
  this->__posUpdated = false;
  *(undefined4 *)((long)&this->m_posVarCnt + 3) = 0;
  this->m_dofCount = 0;
  this->m_posVarCnt = 0;
  btMultibodyLink::btMultibodyLink(&local_288);
  btAlignedObjectArray<btMultibodyLink>::resize(&this->m_links,n_links,&local_288);
  btAlignedObjectArray<btMatrix3x3>::resize
            (&this->m_matrixBuf,n_links + 1,(btMatrix3x3 *)&local_288);
  (this->m_baseTorque).m_floats[0] = 0.0;
  (this->m_baseTorque).m_floats[1] = 0.0;
  (this->m_baseTorque).m_floats[2] = 0.0;
  (this->m_baseTorque).m_floats[3] = 0.0;
  (this->m_baseForce).m_floats[0] = 0.0;
  (this->m_baseForce).m_floats[1] = 0.0;
  (this->m_baseForce).m_floats[2] = 0.0;
  (this->m_baseForce).m_floats[3] = 0.0;
  return;
}

Assistant:

btMultiBody::btMultiBody(int n_links,
                     btScalar mass,
                     const btVector3 &inertia,
                     bool fixedBase,
                     bool canSleep,
		     bool /*deprecatedUseMultiDof*/)
    : 
    	m_baseCollider(0),
		m_baseName(0),
    	m_basePos(0,0,0),
    	m_baseQuat(0, 0, 0, 1),
      m_baseMass(mass),
      m_baseInertia(inertia),
    
		m_fixedBase(fixedBase),
		m_awake(true),
		m_canSleep(canSleep),
		m_sleepTimer(0),
		
		m_linearDamping(0.04f),
		m_angularDamping(0.04f),
		m_useGyroTerm(true),
			m_maxAppliedImpulse(1000.f),
		m_maxCoordinateVelocity(100.f),
			m_hasSelfCollision(true),		
		__posUpdated(false),
			m_dofCount(0),
		m_posVarCnt(0),
		m_useRK4(false), 	
		m_useGlobalVelocities(false),
		m_internalNeedsJointFeedback(false)
{
	m_links.resize(n_links);
	m_matrixBuf.resize(n_links + 1);


    m_baseForce.setValue(0, 0, 0);
    m_baseTorque.setValue(0, 0, 0);
}